

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O0

void iSortDependencies(Abc_Ntk_t *pNtk,Vec_Int_t **iDep,int *oGroup)

{
  Vec_Int_t *p;
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *oGroupList;
  Vec_Int_t *temp;
  int local_28;
  int k;
  int j;
  int i;
  int *oGroup_local;
  Vec_Int_t **iDep_local;
  Abc_Ntk_t *pNtk_local;
  
  p_00 = Vec_IntAlloc(10);
  for (k = 0; iVar1 = Abc_NtkPiNum(pNtk), k < iVar1; k = k + 1) {
    iVar1 = Vec_IntSize(iDep[k]);
    if (iVar1 != 1) {
      iVar1 = Vec_IntSize(iDep[k]);
      p_01 = Vec_IntAlloc(iVar1);
      for (local_28 = 0; iVar1 = Vec_IntSize(iDep[k]), local_28 < iVar1; local_28 = local_28 + 1) {
        iVar1 = Vec_IntEntry(iDep[k],local_28);
        Vec_IntPushUniqueOrder(p_00,oGroup[iVar1]);
      }
      for (local_28 = 0; iVar1 = Vec_IntSize(p_00), local_28 < iVar1; local_28 = local_28 + 1) {
        for (temp._4_4_ = 0; iVar1 = Vec_IntSize(iDep[k]), temp._4_4_ < iVar1;
            temp._4_4_ = temp._4_4_ + 1) {
          iVar1 = Vec_IntEntry(iDep[k],temp._4_4_);
          iVar1 = oGroup[iVar1];
          iVar2 = Vec_IntEntry(p_00,local_28);
          if (iVar1 == iVar2) {
            iVar1 = Vec_IntEntry(iDep[k],temp._4_4_);
            Vec_IntPush(p_01,iVar1);
            p = iDep[k];
            iVar1 = Vec_IntEntry(iDep[k],temp._4_4_);
            Vec_IntRemove(p,iVar1);
            temp._4_4_ = temp._4_4_ + -1;
          }
        }
      }
      Vec_IntFree(iDep[k]);
      iDep[k] = p_01;
      Vec_IntClear(p_00);
    }
  }
  Vec_IntFree(p_00);
  return;
}

Assistant:

void iSortDependencies(Abc_Ntk_t *pNtk, Vec_Int_t** iDep, int* oGroup)
{
    int i, j, k;    
    Vec_Int_t * temp;    
    Vec_Int_t * oGroupList;    

    oGroupList = Vec_IntAlloc( 10 );

    for(i = 0; i < Abc_NtkPiNum(pNtk); i++)
    {
        if(Vec_IntSize(iDep[i]) == 1)
            continue;
        
        temp = Vec_IntAlloc( Vec_IntSize(iDep[i]) );        

        for(j = 0; j < Vec_IntSize(iDep[i]); j++)
            Vec_IntPushUniqueOrder(oGroupList, oGroup[Vec_IntEntry(iDep[i], j)]);

        for(j = 0; j < Vec_IntSize(oGroupList); j++)
        {
            for(k = 0; k < Vec_IntSize(iDep[i]); k++)
                if(oGroup[Vec_IntEntry(iDep[i], k)] == Vec_IntEntry(oGroupList, j))
                {
                    Vec_IntPush( temp, Vec_IntEntry(iDep[i], k) );        
                    Vec_IntRemove( iDep[i], Vec_IntEntry(iDep[i], k) );
                    k--;
                }
        }        

        Vec_IntFree( iDep[i] );        
        iDep[i] = temp;
        Vec_IntClear( oGroupList );

        /*printf("Input %d: ", i);
        for(j = 0; j < Vec_IntSize(iDep[i]); j++)
            printf("%d ", Vec_IntEntry(iDep[i], j));
        printf("\n");*/
    }
    
    Vec_IntFree( oGroupList );
}